

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
* deqp::gles31::Functional::wrapCoreFunctions
            (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *__return_storage_ptr__,
            vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
            *fns)

{
  char *pcVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  TestFunctionWrapper local_40;
  int local_30;
  int ndx;
  undefined1 local_19;
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  *local_18;
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
  *fns_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  *retVal;
  
  local_19 = 0;
  local_18 = fns;
  fns_local = (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
               *)__return_storage_ptr__;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::vector(__return_storage_ptr__);
  sVar3 = std::
          vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
          ::size(local_18);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ::resize(__return_storage_ptr__,sVar3);
  for (local_30 = 0; iVar2 = local_30,
      sVar3 = std::
              vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
              ::size(local_18), iVar2 < (int)sVar3; local_30 = local_30 + 1) {
    pvVar4 = std::
             vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             ::operator[](local_18,(long)local_30);
    anon_unknown_1::TestFunctionWrapper::TestFunctionWrapper(&local_40,pvVar4->function);
    pvVar5 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::operator[](__return_storage_ptr__,(long)local_30);
    (pvVar5->function).m_type = local_40.m_type;
    *(undefined4 *)&(pvVar5->function).field_0x4 = local_40._4_4_;
    (pvVar5->function).m_func = local_40.m_func;
    pvVar4 = std::
             vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             ::operator[](local_18,(long)local_30);
    pcVar1 = pvVar4->name;
    pvVar5 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::operator[](__return_storage_ptr__,(long)local_30);
    pvVar5->name = pcVar1;
    pvVar4 = std::
             vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             ::operator[](local_18,(long)local_30);
    pcVar1 = pvVar4->desc;
    pvVar5 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::operator[](__return_storage_ptr__,(long)local_30);
    pvVar5->desc = pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<FunctionContainer> wrapCoreFunctions (const vector<NegativeTestShared::FunctionContainer>& fns)
{
	vector<FunctionContainer> retVal;

	retVal.resize(fns.size());
	for (int ndx = 0; ndx < (int)fns.size(); ++ndx)
	{
		retVal[ndx].function = TestFunctionWrapper(fns[ndx].function);
		retVal[ndx].name = fns[ndx].name;
		retVal[ndx].desc = fns[ndx].desc;
	}

	return retVal;
}